

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O2

int fffi1i1(uchar *input,long ntodo,double scale,double zero,int nullcheck,uchar tnull,uchar nullval
           ,char *nullarray,int *anynull,uchar *output,int *status)

{
  uchar uVar1;
  long lVar2;
  long lVar3;
  uchar uVar4;
  uchar *puVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    if (scale != 1.0 || zero != 0.0) {
      lVar2 = 0;
      if (ntodo < 1) {
        ntodo = lVar2;
      }
      for (; ntodo != lVar2; lVar2 = lVar2 + 1) {
        dVar6 = (double)input[lVar2] * scale + zero;
        if (-0.49 <= dVar6) {
          if (dVar6 <= 255.49) {
            uVar1 = (uchar)(int)dVar6;
          }
          else {
            *status = -0xb;
            uVar1 = 0xff;
          }
        }
        else {
          *status = -0xb;
          uVar1 = '\0';
        }
        output[lVar2] = uVar1;
      }
    }
    else {
      memmove(output,input,ntodo);
    }
  }
  else {
    lVar2 = 0;
    if (0 < ntodo) {
      lVar2 = ntodo;
    }
    if (scale != 1.0 || zero != 0.0) {
      for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        if (input[lVar3] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[lVar3] = nullval;
          }
          else {
            nullarray[lVar3] = '\x01';
          }
        }
        else {
          dVar6 = (double)input[lVar3] * scale + zero;
          if (-0.49 <= dVar6) {
            if (dVar6 <= 255.49) {
              output[lVar3] = (uchar)(int)dVar6;
            }
            else {
              *status = -0xb;
              output[lVar3] = 0xff;
            }
          }
          else {
            *status = -0xb;
            output[lVar3] = '\0';
          }
        }
      }
    }
    else {
      if (nullcheck == 1) {
        nullarray = (char *)output;
      }
      uVar1 = '\x01';
      if (nullcheck == 1) {
        uVar1 = nullval;
      }
      for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
        puVar5 = output;
        uVar4 = input[lVar3];
        if (input[lVar3] == tnull) {
          *anynull = 1;
          puVar5 = (uchar *)nullarray;
          uVar4 = uVar1;
        }
        puVar5[lVar3] = uVar4;
      }
    }
  }
  return *status;
}

Assistant:

int fffi1i1(unsigned char *input, /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            unsigned char tnull,  /* I - value of FITS TNULLn keyword if any */
            unsigned char nullval,/* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            unsigned char *output,/* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {              /* this routine is normally not called in this case */
           memmove(output, input, ntodo );
        }
        else             /* must scale the data */
        {                
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUCHAR_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUCHAR_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UCHAR_MAX;
                }
                else
                    output[ii] = (unsigned char) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUCHAR_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUCHAR_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UCHAR_MAX;
                    }
                    else
                        output[ii] = (unsigned char) dvalue;
                }
            }
        }
    }
    return(*status);
}